

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

bool GenerateBlock(ChainstateManager *chainman,Mining *miner,CBlock *block,uint64_t *max_tries,
                  shared_ptr<const_CBlock> *block_out,bool process_new_block)

{
  uint32_t *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint256 hash;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  UniValue *__return_storage_ptr__;
  uint64_t uVar7;
  long in_FS_OFFSET;
  undefined1 local_79;
  uint256 local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  bVar5 = false;
  BlockMerkleRoot((uint256 *)local_58,block,(bool *)0x0);
  *(undefined8 *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_58._16_8_;
  *(undefined8 *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
       local_58._24_8_;
  *(undefined8 *)(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems =
       local_58._0_8_;
  *(undefined8 *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
       local_58._8_8_;
  if (*max_tries != 0) {
    if ((block->super_CBlockHeader).nNonce == 0xffffffff) {
LAB_00a2cb55:
      bVar5 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
      if (!bVar5) {
        bVar5 = true;
        if ((block->super_CBlockHeader).nNonce != 0xffffffff) {
          local_58._0_8_ = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<CBlock_const,std::allocator<CBlock>,CBlock&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
                     (CBlock **)local_58,(allocator<CBlock> *)&local_79,block);
          uVar4 = local_58._8_8_;
          uVar3 = local_58._0_8_;
          local_58._0_8_ = (CBlock *)0x0;
          local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)uVar3;
          (block_out->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
          if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
          }
          if ((process_new_block) &&
             (iVar6 = (*miner->_vptr_Mining[6])(miner,block_out,0), (char)iVar6 == '\0')) {
            __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
            local_58._0_8_ = local_58 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_58,"ProcessNewBlock, block not accepted","");
            JSONRPCError(__return_storage_ptr__,-0x7f5b,(string *)local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_00a2cccb;
          }
        }
        goto LAB_00a2cb68;
      }
    }
    else {
      while( true ) {
        CBlockHeader::GetHash(&local_78,&block->super_CBlockHeader);
        hash.super_base_blob<256U>.m_data._M_elems[8] =
             local_78.super_base_blob<256U>.m_data._M_elems[8];
        hash.super_base_blob<256U>.m_data._M_elems[9] =
             local_78.super_base_blob<256U>.m_data._M_elems[9];
        hash.super_base_blob<256U>.m_data._M_elems[10] =
             local_78.super_base_blob<256U>.m_data._M_elems[10];
        hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xb];
        hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xc];
        hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xd];
        hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xe];
        hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             local_78.super_base_blob<256U>.m_data._M_elems[0xf];
        hash.super_base_blob<256U>.m_data._M_elems[0] =
             local_78.super_base_blob<256U>.m_data._M_elems[0];
        hash.super_base_blob<256U>.m_data._M_elems[1] =
             local_78.super_base_blob<256U>.m_data._M_elems[1];
        hash.super_base_blob<256U>.m_data._M_elems[2] =
             local_78.super_base_blob<256U>.m_data._M_elems[2];
        hash.super_base_blob<256U>.m_data._M_elems[3] =
             local_78.super_base_blob<256U>.m_data._M_elems[3];
        hash.super_base_blob<256U>.m_data._M_elems[4] =
             local_78.super_base_blob<256U>.m_data._M_elems[4];
        hash.super_base_blob<256U>.m_data._M_elems[5] =
             local_78.super_base_blob<256U>.m_data._M_elems[5];
        hash.super_base_blob<256U>.m_data._M_elems[6] =
             local_78.super_base_blob<256U>.m_data._M_elems[6];
        hash.super_base_blob<256U>.m_data._M_elems[7] =
             local_78.super_base_blob<256U>.m_data._M_elems[7];
        hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x10];
        hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x11];
        hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x12];
        hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x13];
        hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x14];
        hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x15];
        hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x16];
        hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x17];
        hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x18];
        hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x19];
        hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1a];
        hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1b];
        hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1c];
        hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1d];
        hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1e];
        hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             local_78.super_base_blob<256U>.m_data._M_elems[0x1f];
        bVar5 = CheckProofOfWork(hash,(block->super_CBlockHeader).nBits,
                                 &((chainman->m_options).chainparams)->consensus);
        if (bVar5) break;
        bVar5 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
        uVar7 = *max_tries;
        if (bVar5) goto LAB_00a2cb50;
        puVar1 = &(block->super_CBlockHeader).nNonce;
        *puVar1 = *puVar1 + 1;
        uVar7 = uVar7 - 1;
        *max_tries = uVar7;
        if ((uVar7 == 0) || ((block->super_CBlockHeader).nNonce == 0xffffffff)) goto LAB_00a2cb50;
      }
      uVar7 = *max_tries;
LAB_00a2cb50:
      if (uVar7 != 0) goto LAB_00a2cb55;
    }
    bVar5 = false;
  }
LAB_00a2cb68:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
LAB_00a2cccb:
  __stack_chk_fail();
}

Assistant:

static bool GenerateBlock(ChainstateManager& chainman, Mining& miner, CBlock& block, uint64_t& max_tries, std::shared_ptr<const CBlock>& block_out, bool process_new_block)
{
    block_out.reset();
    block.hashMerkleRoot = BlockMerkleRoot(block);

    while (max_tries > 0 && block.nNonce < std::numeric_limits<uint32_t>::max() && !CheckProofOfWork(block.GetHash(), block.nBits, chainman.GetConsensus()) && !chainman.m_interrupt) {
        ++block.nNonce;
        --max_tries;
    }
    if (max_tries == 0 || chainman.m_interrupt) {
        return false;
    }
    if (block.nNonce == std::numeric_limits<uint32_t>::max()) {
        return true;
    }

    block_out = std::make_shared<const CBlock>(block);

    if (!process_new_block) return true;

    if (!miner.processNewBlock(block_out, nullptr)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "ProcessNewBlock, block not accepted");
    }

    return true;
}